

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void glslang::BuiltInVariable
               (char *blockName,char *name,TBuiltInVariable builtIn,TSymbolTable *symbolTable)

{
  TBuiltInVariable TVar1;
  int iVar2;
  TSymbol *pTVar3;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this;
  size_type sVar4;
  reference pvVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int local_6c;
  int i;
  TTypeList *structure;
  TString local_58;
  TSymbol *local_30;
  TSymbol *symbol;
  TSymbolTable *symbolTable_local;
  char *pcStack_18;
  TBuiltInVariable builtIn_local;
  char *name_local;
  char *blockName_local;
  
  symbol = (TSymbol *)symbolTable;
  symbolTable_local._4_4_ = builtIn;
  pcStack_18 = name;
  name_local = blockName;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&structure);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             blockName,(pool_allocator<char> *)&structure);
  pTVar3 = TSymbolTable::find(symbolTable,&local_58,(bool *)0x0,(bool *)0x0,(int *)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_58);
  if (pTVar3 != (TSymbol *)0x0) {
    local_30 = pTVar3;
    iVar2 = (*pTVar3->_vptr_TSymbol[0xd])();
    this = &TType::getWritableStruct((TType *)CONCAT44(extraout_var,iVar2))->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    for (local_6c = 0;
        sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (this), local_6c < (int)sVar4; local_6c = local_6c + 1) {
      pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this,(long)local_6c);
      iVar2 = (*pvVar5->type->_vptr_TType[6])();
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_00,iVar2),pcStack_18);
      TVar1 = symbolTable_local._4_4_;
      if (iVar2 == 0) {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](this,(long)local_6c);
        iVar2 = (*pvVar5->type->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) =
             *(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0xffffffffffff007f |
             ((ulong)TVar1 & 0x1ff) << 7;
        return;
      }
    }
  }
  return;
}

Assistant:

static void BuiltInVariable(const char* blockName, const char* name, TBuiltInVariable builtIn, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(blockName);
    if (symbol == nullptr)
        return;

    TTypeList& structure = *symbol->getWritableType().getWritableStruct();
    for (int i = 0; i < (int)structure.size(); ++i) {
        if (structure[i].type->getFieldName().compare(name) == 0) {
            structure[i].type->getQualifier().builtIn = builtIn;
            return;
        }
    }
}